

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O3

int run_test_tcp_close_reset_client(void)

{
  int iVar1;
  int iVar2;
  undefined8 *extraout_RDX;
  uv_loop_t *unaff_RBX;
  uv_loop_t *loop;
  uv_tcp_t *in_RSI;
  uv_tcp_t *puVar3;
  uv_tcp_t *puVar4;
  uv_loop_t *puVar5;
  uv_stream_t *server;
  int64_t eval_b;
  int64_t eval_a;
  void *pvStack_c8;
  undefined1 auStack_c0 [16];
  undefined1 auStack_b0 [16];
  uv__queue *puStack_a0;
  undefined1 auStack_98 [16];
  uv__queue *puStack_88;
  undefined1 auStack_80 [16];
  uv__queue *puStack_70;
  undefined1 auStack_68 [32];
  uv_loop_t *puStack_48;
  uv_connect_t *puStack_40;
  undefined1 auStack_38 [24];
  uv_loop_t *puStack_20;
  anon_union_8_2_bf76bca6_for_active_reqs local_18;
  uv_connect_t *local_10;
  
  puStack_20 = (uv_loop_t *)0x1c5632;
  ::loop = uv_default_loop();
  puStack_20 = (uv_loop_t *)0x1c5641;
  start_server(::loop,in_RSI);
  client_close = 1;
  shutdown_before_close = 0;
  puStack_20 = (uv_loop_t *)0x1c565e;
  do_connect(::loop,in_RSI);
  local_10 = (uv_connect_t *)(long)write_cb_called;
  local_18.unused = (void *)0x0;
  if (local_10 == (uv_connect_t *)0x0) {
    local_10 = (uv_connect_t *)(long)close_cb_called;
    local_18.unused = (void *)0x0;
    if (local_10 != (uv_connect_t *)0x0) goto LAB_001c57be;
    local_10 = (uv_connect_t *)(long)shutdown_cb_called;
    local_18.unused = (void *)0x0;
    if (local_10 != (uv_connect_t *)0x0) goto LAB_001c57cb;
    puStack_20 = (uv_loop_t *)0x1c56d5;
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    puVar5 = ::loop;
    local_10 = (uv_connect_t *)(long)iVar1;
    local_18.unused = (void *)0x0;
    if (local_10 != (uv_connect_t *)0x0) goto LAB_001c57d8;
    local_10 = (uv_connect_t *)0x4;
    local_18 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)write_cb_called;
    if (local_18.unused != (void *)0x4) goto LAB_001c57e5;
    local_10 = (uv_connect_t *)0x1;
    local_18 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)close_cb_called;
    if (local_18.unused != (void *)0x1) goto LAB_001c57f2;
    local_10 = (uv_connect_t *)(long)shutdown_cb_called;
    local_18.unused = (void *)0x0;
    if (local_10 != (uv_connect_t *)0x0) goto LAB_001c57ff;
    puStack_20 = (uv_loop_t *)0x1c5774;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    puStack_20 = (uv_loop_t *)0x1c577e;
    uv_run(puVar5,UV_RUN_DEFAULT);
    local_10 = (uv_connect_t *)0x0;
    puStack_20 = (uv_loop_t *)0x1c5793;
    iVar1 = uv_loop_close(::loop);
    local_18 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)iVar1;
    unaff_RBX = puVar5;
    if (local_10 == (uv_connect_t *)local_18.unused) {
      puStack_20 = (uv_loop_t *)0x1c57a9;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_20 = (uv_loop_t *)0x1c57be;
    run_test_tcp_close_reset_client_cold_1();
LAB_001c57be:
    puStack_20 = (uv_loop_t *)0x1c57cb;
    run_test_tcp_close_reset_client_cold_2();
LAB_001c57cb:
    puStack_20 = (uv_loop_t *)0x1c57d8;
    run_test_tcp_close_reset_client_cold_3();
LAB_001c57d8:
    puStack_20 = (uv_loop_t *)0x1c57e5;
    run_test_tcp_close_reset_client_cold_4();
LAB_001c57e5:
    puStack_20 = (uv_loop_t *)0x1c57f2;
    run_test_tcp_close_reset_client_cold_5();
LAB_001c57f2:
    puStack_20 = (uv_loop_t *)0x1c57ff;
    run_test_tcp_close_reset_client_cold_6();
LAB_001c57ff:
    puStack_20 = (uv_loop_t *)0x1c580c;
    run_test_tcp_close_reset_client_cold_7();
  }
  puVar5 = (uv_loop_t *)&stack0xfffffffffffffff0;
  puStack_20 = (uv_loop_t *)start_server;
  run_test_tcp_close_reset_client_cold_8();
  puStack_48 = (uv_loop_t *)0x1c5837;
  puStack_20 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)(auStack_38 + 8));
  auStack_38._0_8_ = SEXT48(iVar1);
  puStack_40 = (uv_connect_t *)0x0;
  if ((uv_shutdown_t *)auStack_38._0_8_ == (uv_shutdown_t *)0x0) {
    puStack_48 = (uv_loop_t *)0x1c5864;
    iVar1 = uv_tcp_init(puVar5,&tcp_server);
    auStack_38._0_8_ = SEXT48(iVar1);
    puStack_40 = (uv_connect_t *)0x0;
    if ((uv_shutdown_t *)auStack_38._0_8_ != (uv_shutdown_t *)0x0) goto LAB_001c58f0;
    puStack_48 = (uv_loop_t *)0x1c5891;
    iVar1 = uv_tcp_bind(&tcp_server,(sockaddr *)(auStack_38 + 8),0);
    auStack_38._0_8_ = SEXT48(iVar1);
    puStack_40 = (uv_connect_t *)0x0;
    if ((uv_shutdown_t *)auStack_38._0_8_ != (uv_shutdown_t *)0x0) goto LAB_001c58fd;
    puStack_48 = (uv_loop_t *)0x1c58c3;
    iVar1 = uv_listen((uv_stream_t *)&tcp_server,0x80,connection_cb);
    auStack_38._0_8_ = SEXT48(iVar1);
    puStack_40 = (uv_connect_t *)0x0;
    if ((uv_shutdown_t *)auStack_38._0_8_ == (uv_shutdown_t *)0x0) {
      return iVar1;
    }
  }
  else {
    puStack_48 = (uv_loop_t *)0x1c58f0;
    start_server_cold_1();
LAB_001c58f0:
    puStack_48 = (uv_loop_t *)0x1c58fd;
    start_server_cold_2();
LAB_001c58fd:
    puStack_48 = (uv_loop_t *)0x1c590a;
    start_server_cold_3();
  }
  loop = (uv_loop_t *)auStack_38;
  puStack_48 = (uv_loop_t *)do_connect;
  start_server_cold_4();
  puVar3 = (uv_tcp_t *)auStack_68;
  puStack_70 = (uv__queue *)0x1c5935;
  puStack_48 = puVar5;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)(auStack_68 + 0x10));
  auStack_68._8_8_ = SEXT48(iVar1);
  auStack_68._0_8_ = (uv_connect_t *)0x0;
  if ((uv_loop_t *)auStack_68._8_8_ == (uv_loop_t *)0x0) {
    puStack_70 = (uv__queue *)0x1c595e;
    iVar1 = uv_tcp_init(loop,&tcp_client);
    auStack_68._8_8_ = SEXT48(iVar1);
    auStack_68._0_8_ = (uv_connect_t *)0x0;
    if ((uv_loop_t *)auStack_68._8_8_ != (uv_loop_t *)0x0) goto LAB_001c59c4;
    puStack_70 = (uv__queue *)0x1c5997;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_client,(sockaddr *)(auStack_68 + 0x10),connect_cb);
    auStack_68._8_8_ = SEXT48(iVar1);
    auStack_68._0_8_ = (uv_connect_t *)0x0;
    if ((uv_loop_t *)auStack_68._8_8_ == (uv_loop_t *)0x0) {
      return iVar1;
    }
  }
  else {
    puStack_70 = (uv__queue *)0x1c59c4;
    do_connect_cold_1();
LAB_001c59c4:
    puStack_70 = (uv__queue *)0x1c59d1;
    do_connect_cold_2();
  }
  puStack_70 = (uv__queue *)run_test_tcp_close_reset_client_after_shutdown;
  do_connect_cold_3();
  puVar4 = (uv_tcp_t *)auStack_80;
  puStack_88 = (uv__queue *)0x1c59e8;
  puStack_70 = (uv__queue *)loop;
  ::loop = uv_default_loop();
  puStack_88 = (uv__queue *)0x1c59f7;
  start_server(::loop,puVar3);
  client_close = 1;
  shutdown_before_close = 1;
  puStack_88 = (uv__queue *)0x1c5a14;
  do_connect(::loop,puVar3);
  auStack_80._8_8_ = SEXT48(write_cb_called);
  auStack_80._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_80._8_8_ == (uv_loop_t *)0x0) {
    auStack_80._8_8_ = SEXT48(close_cb_called);
    auStack_80._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_80._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5b74;
    auStack_80._8_8_ = SEXT48(shutdown_cb_called);
    auStack_80._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_80._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5b81;
    puStack_88 = (uv__queue *)0x1c5a8b;
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    puVar5 = ::loop;
    auStack_80._8_8_ = SEXT48(iVar1);
    auStack_80._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_80._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5b8e;
    auStack_80._8_8_ = (uv_loop_t *)0x4;
    auStack_80._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_80._0_8_ != (uv_loop_t *)0x4) goto LAB_001c5b9b;
    auStack_80._8_8_ = SEXT48(close_cb_called);
    auStack_80._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_80._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5ba8;
    auStack_80._8_8_ = (uv_loop_t *)0x1;
    auStack_80._0_8_ = SEXT48(shutdown_cb_called);
    if ((uv_loop_t *)auStack_80._0_8_ != (uv_loop_t *)0x1) goto LAB_001c5bb5;
    puStack_88 = (uv__queue *)0x1c5b2a;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    puStack_88 = (uv__queue *)0x1c5b34;
    uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_80._8_8_ = (uv_loop_t *)0x0;
    puStack_88 = (uv__queue *)0x1c5b49;
    iVar1 = uv_loop_close(::loop);
    auStack_80._0_8_ = SEXT48(iVar1);
    loop = puVar5;
    if (auStack_80._8_8_ == auStack_80._0_8_) {
      puStack_88 = (uv__queue *)0x1c5b5f;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_88 = (uv__queue *)0x1c5b74;
    run_test_tcp_close_reset_client_after_shutdown_cold_1();
LAB_001c5b74:
    puStack_88 = (uv__queue *)0x1c5b81;
    run_test_tcp_close_reset_client_after_shutdown_cold_2();
LAB_001c5b81:
    puStack_88 = (uv__queue *)0x1c5b8e;
    run_test_tcp_close_reset_client_after_shutdown_cold_3();
LAB_001c5b8e:
    puStack_88 = (uv__queue *)0x1c5b9b;
    run_test_tcp_close_reset_client_after_shutdown_cold_4();
LAB_001c5b9b:
    puStack_88 = (uv__queue *)0x1c5ba8;
    run_test_tcp_close_reset_client_after_shutdown_cold_5();
LAB_001c5ba8:
    puStack_88 = (uv__queue *)0x1c5bb5;
    run_test_tcp_close_reset_client_after_shutdown_cold_6();
LAB_001c5bb5:
    puStack_88 = (uv__queue *)0x1c5bc2;
    run_test_tcp_close_reset_client_after_shutdown_cold_7();
  }
  puStack_88 = (uv__queue *)run_test_tcp_close_reset_accepted;
  run_test_tcp_close_reset_client_after_shutdown_cold_8();
  puVar3 = (uv_tcp_t *)auStack_98;
  puStack_a0 = (uv__queue *)0x1c5bd9;
  puStack_88 = (uv__queue *)loop;
  ::loop = uv_default_loop();
  puStack_a0 = (uv__queue *)0x1c5be8;
  start_server(::loop,puVar4);
  client_close = 0;
  shutdown_before_close = 0;
  puStack_a0 = (uv__queue *)0x1c5c05;
  do_connect(::loop,puVar4);
  auStack_98._8_8_ = SEXT48(write_cb_called);
  auStack_98._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_98._8_8_ == (uv_loop_t *)0x0) {
    auStack_98._8_8_ = SEXT48(close_cb_called);
    auStack_98._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_98._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5d65;
    auStack_98._8_8_ = SEXT48(shutdown_cb_called);
    auStack_98._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_98._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5d72;
    puStack_a0 = (uv__queue *)0x1c5c7c;
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    puVar5 = ::loop;
    auStack_98._8_8_ = SEXT48(iVar1);
    auStack_98._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_98._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5d7f;
    auStack_98._8_8_ = (uv_loop_t *)0x4;
    auStack_98._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_98._0_8_ != (uv_loop_t *)0x4) goto LAB_001c5d8c;
    auStack_98._8_8_ = (uv_loop_t *)0x1;
    auStack_98._0_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)auStack_98._0_8_ != (uv_loop_t *)0x1) goto LAB_001c5d99;
    auStack_98._8_8_ = SEXT48(shutdown_cb_called);
    auStack_98._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_98._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5da6;
    puStack_a0 = (uv__queue *)0x1c5d1b;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    puStack_a0 = (uv__queue *)0x1c5d25;
    uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_98._8_8_ = (uv_loop_t *)0x0;
    puStack_a0 = (uv__queue *)0x1c5d3a;
    iVar1 = uv_loop_close(::loop);
    auStack_98._0_8_ = SEXT48(iVar1);
    loop = puVar5;
    if (auStack_98._8_8_ == auStack_98._0_8_) {
      puStack_a0 = (uv__queue *)0x1c5d50;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_a0 = (uv__queue *)0x1c5d65;
    run_test_tcp_close_reset_accepted_cold_1();
LAB_001c5d65:
    puStack_a0 = (uv__queue *)0x1c5d72;
    run_test_tcp_close_reset_accepted_cold_2();
LAB_001c5d72:
    puStack_a0 = (uv__queue *)0x1c5d7f;
    run_test_tcp_close_reset_accepted_cold_3();
LAB_001c5d7f:
    puStack_a0 = (uv__queue *)0x1c5d8c;
    run_test_tcp_close_reset_accepted_cold_4();
LAB_001c5d8c:
    puStack_a0 = (uv__queue *)0x1c5d99;
    run_test_tcp_close_reset_accepted_cold_5();
LAB_001c5d99:
    puStack_a0 = (uv__queue *)0x1c5da6;
    run_test_tcp_close_reset_accepted_cold_6();
LAB_001c5da6:
    puStack_a0 = (uv__queue *)0x1c5db3;
    run_test_tcp_close_reset_accepted_cold_7();
  }
  puStack_a0 = (uv__queue *)run_test_tcp_close_reset_accepted_after_shutdown;
  run_test_tcp_close_reset_accepted_cold_8();
  puVar4 = (uv_tcp_t *)auStack_b0;
  auStack_c0._8_8_ = (uv_loop_t *)0x1c5dca;
  puStack_a0 = (uv__queue *)loop;
  ::loop = uv_default_loop();
  auStack_c0._8_8_ = (uv_loop_t *)0x1c5dd9;
  start_server(::loop,puVar3);
  client_close = 0;
  shutdown_before_close = 1;
  auStack_c0._8_8_ = (uv_loop_t *)0x1c5df6;
  do_connect(::loop,puVar3);
  auStack_b0._8_8_ = SEXT48(write_cb_called);
  auStack_b0._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_b0._8_8_ == (uv_loop_t *)0x0) {
    auStack_b0._8_8_ = SEXT48(close_cb_called);
    auStack_b0._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_b0._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5f56;
    auStack_b0._8_8_ = SEXT48(shutdown_cb_called);
    auStack_b0._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_b0._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5f63;
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5e6d;
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    puVar5 = ::loop;
    auStack_b0._8_8_ = SEXT48(iVar1);
    auStack_b0._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_b0._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5f70;
    auStack_b0._8_8_ = (uv_loop_t *)0x4;
    auStack_b0._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_b0._0_8_ != (uv_loop_t *)0x4) goto LAB_001c5f7d;
    auStack_b0._8_8_ = SEXT48(close_cb_called);
    auStack_b0._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_b0._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5f8a;
    auStack_b0._8_8_ = (uv_loop_t *)0x1;
    auStack_b0._0_8_ = SEXT48(shutdown_cb_called);
    if ((uv_loop_t *)auStack_b0._0_8_ != (uv_loop_t *)0x1) goto LAB_001c5f97;
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5f0c;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5f16;
    uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_b0._8_8_ = (uv_loop_t *)0x0;
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5f2b;
    iVar1 = uv_loop_close(::loop);
    auStack_b0._0_8_ = SEXT48(iVar1);
    loop = puVar5;
    if (auStack_b0._8_8_ == auStack_b0._0_8_) {
      auStack_c0._8_8_ = (uv_loop_t *)0x1c5f41;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5f56;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_1();
LAB_001c5f56:
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5f63;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_2();
LAB_001c5f63:
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5f70;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_3();
LAB_001c5f70:
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5f7d;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_4();
LAB_001c5f7d:
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5f8a;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_5();
LAB_001c5f8a:
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5f97;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_6();
LAB_001c5f97:
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5fa4;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_7();
  }
  auStack_c0._8_8_ = run_test_tcp_close_reset_accepted_after_socket_shutdown;
  run_test_tcp_close_reset_accepted_after_shutdown_cold_8();
  iVar1 = (int)&pvStack_c8;
  auStack_c0._8_8_ = loop;
  ::loop = uv_default_loop();
  start_server(::loop,puVar4);
  client_close = 0;
  shutdown_before_close = 2;
  do_connect(::loop,puVar4);
  auStack_c0._0_8_ = SEXT48(write_cb_called);
  pvStack_c8 = (void *)0x0;
  if ((void *)auStack_c0._0_8_ == (void *)0x0) {
    auStack_c0._0_8_ = SEXT48(close_cb_called);
    pvStack_c8 = (void *)0x0;
    if ((void *)auStack_c0._0_8_ != (void *)0x0) goto LAB_001c6147;
    auStack_c0._0_8_ = SEXT48(shutdown_cb_called);
    pvStack_c8 = (void *)0x0;
    if ((void *)auStack_c0._0_8_ != (void *)0x0) goto LAB_001c6154;
    iVar2 = uv_run(::loop,UV_RUN_DEFAULT);
    puVar5 = ::loop;
    auStack_c0._0_8_ = SEXT48(iVar2);
    pvStack_c8 = (void *)0x0;
    if ((void *)auStack_c0._0_8_ != (void *)0x0) goto LAB_001c6161;
    auStack_c0._0_8_ = (void *)0x4;
    pvStack_c8 = (void *)(long)write_cb_called;
    if (pvStack_c8 != (void *)0x4) goto LAB_001c616e;
    auStack_c0._0_8_ = (void *)0x1;
    pvStack_c8 = (void *)(long)close_cb_called;
    if (pvStack_c8 != (void *)0x1) goto LAB_001c617b;
    auStack_c0._0_8_ = SEXT48(shutdown_cb_called);
    pvStack_c8 = (void *)0x0;
    if ((void *)auStack_c0._0_8_ != (void *)0x0) goto LAB_001c6188;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_c0._0_8_ = (void *)0x0;
    iVar2 = uv_loop_close(::loop);
    pvStack_c8 = (void *)(long)iVar2;
    if ((void *)auStack_c0._0_8_ == pvStack_c8) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_1();
LAB_001c6147:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_2();
LAB_001c6154:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_3();
LAB_001c6161:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_4();
LAB_001c616e:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_5();
LAB_001c617b:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_6();
LAB_001c6188:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_7();
  }
  server = (uv_stream_t *)auStack_c0;
  run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_8();
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(::loop,&tcp_accepted);
    if (iVar1 == 0) {
      iVar1 = uv_accept(server,(uv_stream_t *)&tcp_accepted);
      if (iVar1 == 0) {
        iVar1 = uv_read_start((uv_stream_t *)&tcp_accepted,alloc_cb,read_cb);
        return iVar1;
      }
      goto LAB_001c6254;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_001c6254:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return 0x399040;
}

Assistant:

TEST_IMPL(tcp_close_reset_client) {
  int r;

  loop = uv_default_loop();

  start_server(loop, &tcp_server);

  client_close = 1;
  shutdown_before_close = 0;

  do_connect(loop, &tcp_client);

  ASSERT_OK(write_cb_called);
  ASSERT_OK(close_cb_called);
  ASSERT_OK(shutdown_cb_called);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(4, write_cb_called);
  ASSERT_EQ(1, close_cb_called);
  ASSERT_OK(shutdown_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}